

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

string * GetNetworkName_abi_cxx11_(string *__return_storage_ptr__,Network net)

{
  allocator<char> *__a;
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(net) {
  case NET_UNROUTABLE:
    __s = "not_publicly_routable";
    __a = &local_11;
    break;
  case NET_IPV4:
    __s = "ipv4";
    __a = &local_12;
    break;
  case NET_IPV6:
    __s = "ipv6";
    __a = &local_13;
    break;
  case NET_ONION:
    __s = "onion";
    __a = &local_14;
    break;
  case NET_I2P:
    __s = "i2p";
    __a = &local_15;
    break;
  case NET_CJDNS:
    __s = "cjdns";
    __a = &local_16;
    break;
  case NET_INTERNAL:
    __s = "internal";
    __a = &local_17;
    break;
  case NET_MAX:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x80,"std::string GetNetworkName(enum Network)");
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x83,"std::string GetNetworkName(enum Network)");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNetworkName(enum Network net)
{
    switch (net) {
    case NET_UNROUTABLE: return "not_publicly_routable";
    case NET_IPV4: return "ipv4";
    case NET_IPV6: return "ipv6";
    case NET_ONION: return "onion";
    case NET_I2P: return "i2p";
    case NET_CJDNS: return "cjdns";
    case NET_INTERNAL: return "internal";
    case NET_MAX: assert(false);
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}